

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::CompilerGLSL::type_can_zero_initialize(CompilerGLSL *this,SPIRType *type)

{
  bool *pbVar1;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar2;
  bool bVar3;
  SPIRType *type_00;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  if ((type->pointer == false) &&
     (((type->array).super_VectorView<unsigned_int>.buffer_size == 0 ||
      ((this->options).flatten_multidimensional_arrays == false)))) {
    sVar4 = 0;
    do {
      if ((type->array_size_literal).super_VectorView<bool>.buffer_size == sVar4) {
        pTVar2 = (type->member_types).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                 ptr;
        sVar4 = (type->member_types).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                buffer_size;
        lVar5 = 0;
        do {
          bVar6 = sVar4 << 2 == lVar5;
          if (bVar6) {
            return bVar6;
          }
          type_00 = Compiler::get<diligent_spirv_cross::SPIRType>
                              (&this->super_Compiler,*(uint32_t *)((long)&pTVar2->id + lVar5));
          bVar3 = type_can_zero_initialize(this,type_00);
          lVar5 = lVar5 + 4;
        } while (bVar3);
        return bVar6;
      }
      pbVar1 = (type->array_size_literal).super_VectorView<bool>.ptr + sVar4;
      sVar4 = sVar4 + 1;
    } while (*pbVar1 != false);
  }
  return false;
}

Assistant:

bool CompilerGLSL::type_can_zero_initialize(const SPIRType &type) const
{
	if (type.pointer)
		return false;

	if (!type.array.empty() && options.flatten_multidimensional_arrays)
		return false;

	for (auto &literal : type.array_size_literal)
		if (!literal)
			return false;

	for (auto &memb : type.member_types)
		if (!type_can_zero_initialize(get<SPIRType>(memb)))
			return false;

	return true;
}